

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TUDPTransport.h
# Opt level: O1

void __thiscall
jaegertracing::testutils::TUDPTransport::TUDPTransport(TUDPTransport *this,IPAddress *addr)

{
  Socket *this_00;
  IPAddress *pIVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  int iVar8;
  socklen_t in_ECX;
  long lVar9;
  sockaddr *__addr;
  sockaddr *psVar10;
  IPAddress *this_01;
  byte bVar11;
  socklen_t addrLen;
  sockaddr_storage addrStorage;
  socklen_t local_a4;
  sockaddr local_a0 [8];
  
  bVar11 = 0;
  (this->
  super_TVirtualTransport<jaegertracing::testutils::TUDPTransport,_apache::thrift::transport::TTransportDefaults>
  ).super_TTransportDefaults.super_TTransport._vptr_TTransport =
       (_func_int **)&PTR__TUDPTransport_00211548;
  this_00 = &this->_socket;
  jaegertracing::net::Socket::OSResource::OSResource(&this_00->_osResource);
  (this->_socket)._handle = -1;
  (this->_socket)._family = -1;
  (this->_socket)._type = -1;
  this_01 = &this->_serverAddr;
  memcpy(this_01,addr,0x88);
  (this->_clientAddr)._addr.ss_family = 0;
  (this->_clientAddr)._addr.__ss_padding[0] = '\0';
  (this->_clientAddr)._addr.__ss_padding[1] = '\0';
  (this->_clientAddr)._addr.__ss_padding[2] = '\0';
  (this->_clientAddr)._addr.__ss_padding[3] = '\0';
  (this->_clientAddr)._addr.__ss_padding[4] = '\0';
  (this->_clientAddr)._addr.__ss_padding[5] = '\0';
  pIVar1 = &this->_clientAddr;
  (pIVar1->_addr).__ss_padding[6] = '\0';
  (pIVar1->_addr).__ss_padding[7] = '\0';
  (pIVar1->_addr).__ss_padding[8] = '\0';
  (pIVar1->_addr).__ss_padding[9] = '\0';
  (pIVar1->_addr).__ss_padding[10] = '\0';
  (pIVar1->_addr).__ss_padding[0xb] = '\0';
  (pIVar1->_addr).__ss_padding[0xc] = '\0';
  (pIVar1->_addr).__ss_padding[0xd] = '\0';
  pIVar1 = &this->_clientAddr;
  (pIVar1->_addr).__ss_padding[0xe] = '\0';
  (pIVar1->_addr).__ss_padding[0xf] = '\0';
  (pIVar1->_addr).__ss_padding[0x10] = '\0';
  (pIVar1->_addr).__ss_padding[0x11] = '\0';
  (pIVar1->_addr).__ss_padding[0x12] = '\0';
  (pIVar1->_addr).__ss_padding[0x13] = '\0';
  (pIVar1->_addr).__ss_padding[0x14] = '\0';
  (pIVar1->_addr).__ss_padding[0x15] = '\0';
  pIVar1 = &this->_clientAddr;
  (pIVar1->_addr).__ss_padding[0x16] = '\0';
  (pIVar1->_addr).__ss_padding[0x17] = '\0';
  (pIVar1->_addr).__ss_padding[0x18] = '\0';
  (pIVar1->_addr).__ss_padding[0x19] = '\0';
  (pIVar1->_addr).__ss_padding[0x1a] = '\0';
  (pIVar1->_addr).__ss_padding[0x1b] = '\0';
  (pIVar1->_addr).__ss_padding[0x1c] = '\0';
  (pIVar1->_addr).__ss_padding[0x1d] = '\0';
  pIVar1 = &this->_clientAddr;
  (pIVar1->_addr).__ss_padding[0x1e] = '\0';
  (pIVar1->_addr).__ss_padding[0x1f] = '\0';
  (pIVar1->_addr).__ss_padding[0x20] = '\0';
  (pIVar1->_addr).__ss_padding[0x21] = '\0';
  (pIVar1->_addr).__ss_padding[0x22] = '\0';
  (pIVar1->_addr).__ss_padding[0x23] = '\0';
  (pIVar1->_addr).__ss_padding[0x24] = '\0';
  (pIVar1->_addr).__ss_padding[0x25] = '\0';
  pIVar1 = &this->_clientAddr;
  (pIVar1->_addr).__ss_padding[0x26] = '\0';
  (pIVar1->_addr).__ss_padding[0x27] = '\0';
  (pIVar1->_addr).__ss_padding[0x28] = '\0';
  (pIVar1->_addr).__ss_padding[0x29] = '\0';
  (pIVar1->_addr).__ss_padding[0x2a] = '\0';
  (pIVar1->_addr).__ss_padding[0x2b] = '\0';
  (pIVar1->_addr).__ss_padding[0x2c] = '\0';
  (pIVar1->_addr).__ss_padding[0x2d] = '\0';
  pIVar1 = &this->_clientAddr;
  (pIVar1->_addr).__ss_padding[0x2e] = '\0';
  (pIVar1->_addr).__ss_padding[0x2f] = '\0';
  (pIVar1->_addr).__ss_padding[0x30] = '\0';
  (pIVar1->_addr).__ss_padding[0x31] = '\0';
  (pIVar1->_addr).__ss_padding[0x32] = '\0';
  (pIVar1->_addr).__ss_padding[0x33] = '\0';
  (pIVar1->_addr).__ss_padding[0x34] = '\0';
  (pIVar1->_addr).__ss_padding[0x35] = '\0';
  pIVar1 = &this->_clientAddr;
  (pIVar1->_addr).__ss_padding[0x36] = '\0';
  (pIVar1->_addr).__ss_padding[0x37] = '\0';
  (pIVar1->_addr).__ss_padding[0x38] = '\0';
  (pIVar1->_addr).__ss_padding[0x39] = '\0';
  (pIVar1->_addr).__ss_padding[0x3a] = '\0';
  (pIVar1->_addr).__ss_padding[0x3b] = '\0';
  (pIVar1->_addr).__ss_padding[0x3c] = '\0';
  (pIVar1->_addr).__ss_padding[0x3d] = '\0';
  pIVar1 = &this->_clientAddr;
  (pIVar1->_addr).__ss_padding[0x3e] = '\0';
  (pIVar1->_addr).__ss_padding[0x3f] = '\0';
  (pIVar1->_addr).__ss_padding[0x40] = '\0';
  (pIVar1->_addr).__ss_padding[0x41] = '\0';
  (pIVar1->_addr).__ss_padding[0x42] = '\0';
  (pIVar1->_addr).__ss_padding[0x43] = '\0';
  (pIVar1->_addr).__ss_padding[0x44] = '\0';
  (pIVar1->_addr).__ss_padding[0x45] = '\0';
  pIVar1 = &this->_clientAddr;
  (pIVar1->_addr).__ss_padding[0x46] = '\0';
  (pIVar1->_addr).__ss_padding[0x47] = '\0';
  (pIVar1->_addr).__ss_padding[0x48] = '\0';
  (pIVar1->_addr).__ss_padding[0x49] = '\0';
  (pIVar1->_addr).__ss_padding[0x4a] = '\0';
  (pIVar1->_addr).__ss_padding[0x4b] = '\0';
  (pIVar1->_addr).__ss_padding[0x4c] = '\0';
  (pIVar1->_addr).__ss_padding[0x4d] = '\0';
  pIVar1 = &this->_clientAddr;
  (pIVar1->_addr).__ss_padding[0x4e] = '\0';
  (pIVar1->_addr).__ss_padding[0x4f] = '\0';
  (pIVar1->_addr).__ss_padding[0x50] = '\0';
  (pIVar1->_addr).__ss_padding[0x51] = '\0';
  (pIVar1->_addr).__ss_padding[0x52] = '\0';
  (pIVar1->_addr).__ss_padding[0x53] = '\0';
  (pIVar1->_addr).__ss_padding[0x54] = '\0';
  (pIVar1->_addr).__ss_padding[0x55] = '\0';
  pIVar1 = &this->_clientAddr;
  (pIVar1->_addr).__ss_padding[0x56] = '\0';
  (pIVar1->_addr).__ss_padding[0x57] = '\0';
  (pIVar1->_addr).__ss_padding[0x58] = '\0';
  (pIVar1->_addr).__ss_padding[0x59] = '\0';
  (pIVar1->_addr).__ss_padding[0x5a] = '\0';
  (pIVar1->_addr).__ss_padding[0x5b] = '\0';
  (pIVar1->_addr).__ss_padding[0x5c] = '\0';
  (pIVar1->_addr).__ss_padding[0x5d] = '\0';
  pIVar1 = &this->_clientAddr;
  (pIVar1->_addr).__ss_padding[0x5e] = '\0';
  (pIVar1->_addr).__ss_padding[0x5f] = '\0';
  (pIVar1->_addr).__ss_padding[0x60] = '\0';
  (pIVar1->_addr).__ss_padding[0x61] = '\0';
  (pIVar1->_addr).__ss_padding[0x62] = '\0';
  (pIVar1->_addr).__ss_padding[99] = '\0';
  (pIVar1->_addr).__ss_padding[100] = '\0';
  (pIVar1->_addr).__ss_padding[0x65] = '\0';
  pIVar1 = &this->_clientAddr;
  (pIVar1->_addr).__ss_padding[0x66] = '\0';
  (pIVar1->_addr).__ss_padding[0x67] = '\0';
  (pIVar1->_addr).__ss_padding[0x68] = '\0';
  (pIVar1->_addr).__ss_padding[0x69] = '\0';
  (pIVar1->_addr).__ss_padding[0x6a] = '\0';
  (pIVar1->_addr).__ss_padding[0x6b] = '\0';
  (pIVar1->_addr).__ss_padding[0x6c] = '\0';
  (pIVar1->_addr).__ss_padding[0x6d] = '\0';
  pIVar1 = &this->_clientAddr;
  (pIVar1->_addr).__ss_padding[0x6e] = '\0';
  (pIVar1->_addr).__ss_padding[0x6f] = '\0';
  (pIVar1->_addr).__ss_padding[0x70] = '\0';
  (pIVar1->_addr).__ss_padding[0x71] = '\0';
  (pIVar1->_addr).__ss_padding[0x72] = '\0';
  (pIVar1->_addr).__ss_padding[0x73] = '\0';
  (pIVar1->_addr).__ss_padding[0x74] = '\0';
  (pIVar1->_addr).__ss_padding[0x75] = '\0';
  (this->_clientAddr)._addr.__ss_align = 0;
  (this->_clientAddr)._addrLen = 0x10;
  net::Socket::open(this_00,(char *)0x2,2);
  net::Socket::bind(this_00,(int)this_01,__addr,in_ECX);
  iVar8 = net::IPAddress::port(this_01);
  if (iVar8 == 0) {
    local_a4 = 0x80;
    iVar8 = getsockname((this->_socket)._handle,local_a0,&local_a4);
    if (iVar8 == 0) {
      psVar10 = local_a0;
      for (lVar9 = 0x10; lVar9 != 0; lVar9 = lVar9 + -1) {
        cVar2 = psVar10->sa_data[0];
        cVar3 = psVar10->sa_data[1];
        cVar4 = psVar10->sa_data[2];
        cVar5 = psVar10->sa_data[3];
        cVar6 = psVar10->sa_data[4];
        cVar7 = psVar10->sa_data[5];
        (this_01->_addr).ss_family = psVar10->sa_family;
        (this_01->_addr).__ss_padding[0] = cVar2;
        (this_01->_addr).__ss_padding[1] = cVar3;
        (this_01->_addr).__ss_padding[2] = cVar4;
        (this_01->_addr).__ss_padding[3] = cVar5;
        (this_01->_addr).__ss_padding[4] = cVar6;
        (this_01->_addr).__ss_padding[5] = cVar7;
        psVar10 = (sockaddr *)(psVar10[-(ulong)bVar11].sa_data + 6);
        this_01 = (IPAddress *)((long)this_01 + (ulong)bVar11 * -0x10 + 8);
      }
      (this->_serverAddr)._addrLen = local_a4;
    }
  }
  return;
}

Assistant:

explicit TUDPTransport(const net::IPAddress& addr)
        : _socket()
        , _serverAddr(addr)
    {
        _socket.open(AF_INET, SOCK_DGRAM);
        _socket.bind(_serverAddr);
        if (_serverAddr.port() == 0) {
            ::sockaddr_storage addrStorage;
            ::socklen_t addrLen = sizeof(addrStorage);
            const auto returnCode =
                ::getsockname(_socket.handle(),
                              reinterpret_cast<::sockaddr*>(&addrStorage),
                              &addrLen);
            if (returnCode == 0) {
                _serverAddr = net::IPAddress(addrStorage, addrLen);
            }
        }
    }